

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmWin.c
# Opt level: O0

int Sfm_NtkCollectTfi_rec(Sfm_Ntk_t *p,int iNode,Vec_Int_t *vNodes)

{
  int iVar1;
  bool local_39;
  int local_2c;
  int iFanin;
  int i;
  Vec_Int_t *vNodes_local;
  int iNode_local;
  Sfm_Ntk_t *p_local;
  
  iVar1 = Sfm_ObjIsTravIdCurrent(p,iNode);
  if (iVar1 == 0) {
    Sfm_ObjSetTravIdCurrent(p,iNode);
    for (local_2c = 0; iVar1 = Sfm_ObjFaninNum(p,iNode), local_2c < iVar1; local_2c = local_2c + 1)
    {
      iVar1 = Sfm_ObjFanin(p,iNode,local_2c);
      iVar1 = Sfm_NtkCollectTfi_rec(p,iVar1,vNodes);
      if (iVar1 != 0) {
        return 1;
      }
    }
    Vec_IntPush(vNodes,iNode);
    local_39 = false;
    if (p->pPars->nWinSizeMax != 0) {
      iVar1 = Vec_IntSize(vNodes);
      local_39 = p->pPars->nWinSizeMax < iVar1;
    }
    p_local._4_4_ = (uint)local_39;
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Sfm_NtkCollectTfi_rec( Sfm_Ntk_t * p, int iNode, Vec_Int_t * vNodes )
{
    int i, iFanin;
    if ( Sfm_ObjIsTravIdCurrent( p, iNode ) )
        return 0;
    Sfm_ObjSetTravIdCurrent( p, iNode );
    Sfm_ObjForEachFanin( p, iNode, iFanin, i )
        if ( Sfm_NtkCollectTfi_rec( p, iFanin, vNodes ) )
            return 1;
    Vec_IntPush( vNodes, iNode );
    return p->pPars->nWinSizeMax && (Vec_IntSize(vNodes) > p->pPars->nWinSizeMax);
}